

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslinearlayout.cpp
# Opt level: O0

void __thiscall QGraphicsLinearLayout::dump(QGraphicsLinearLayout *this,int indent)

{
  int indent_local;
  QGraphicsLinearLayout *this_local;
  
  return;
}

Assistant:

void QGraphicsLinearLayout::dump(int indent) const
{
#ifdef QGRIDLAYOUTENGINE_DEBUG
    if (qt_graphicsLayoutDebug()) {
        Q_D(const QGraphicsLinearLayout);
        qDebug("%*s%s layout", indent, "",
               d->orientation == Qt::Horizontal ? "Horizontal" : "Vertical");
        d->engine.dump(indent + 1);
    }
#else
    Q_UNUSED(indent);
#endif
}